

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# literal.h
# Opt level: O0

Type __thiscall wasm::Literals::getType(Literals *this)

{
  bool bVar1;
  size_t sVar2;
  Literal *pLVar3;
  value_type *pvVar4;
  ConstIterator CVar5;
  IteratorBase<const_wasm::SmallVector<wasm::Literal,_1UL>,_wasm::SmallVector<wasm::Literal,_1UL>::ConstIterator>
  IVar6;
  value_type *val;
  ConstIterator __end2;
  undefined1 local_48 [8];
  ConstIterator __begin2;
  Literals *__range2;
  vector<wasm::Type,_std::allocator<wasm::Type>_> types;
  Literals *this_local;
  
  types.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)this;
  bVar1 = SmallVector<wasm::Literal,_1UL>::empty(&this->super_SmallVector<wasm::Literal,_1UL>);
  if (bVar1) {
    wasm::Type::Type((Type *)&this_local,none);
  }
  else {
    sVar2 = SmallVector<wasm::Literal,_1UL>::size(&this->super_SmallVector<wasm::Literal,_1UL>);
    if (sVar2 == 1) {
      pLVar3 = SmallVector<wasm::Literal,_1UL>::operator[]
                         (&this->super_SmallVector<wasm::Literal,_1UL>,0);
      this_local = (Literals *)(pLVar3->type).id;
    }
    else {
      std::vector<wasm::Type,_std::allocator<wasm::Type>_>::vector
                ((vector<wasm::Type,_std::allocator<wasm::Type>_> *)&__range2);
      __begin2.
      super_IteratorBase<const_wasm::SmallVector<wasm::Literal,_1UL>,_wasm::SmallVector<wasm::Literal,_1UL>::ConstIterator>
      .index = (size_t)this;
      CVar5 = SmallVector<wasm::Literal,_1UL>::begin(&this->super_SmallVector<wasm::Literal,_1UL>);
      __begin2.
      super_IteratorBase<const_wasm::SmallVector<wasm::Literal,_1UL>,_wasm::SmallVector<wasm::Literal,_1UL>::ConstIterator>
      .parent = (SmallVector<wasm::Literal,_1UL> *)
                CVar5.
                super_IteratorBase<const_wasm::SmallVector<wasm::Literal,_1UL>,_wasm::SmallVector<wasm::Literal,_1UL>::ConstIterator>
                .index;
      local_48 = (undefined1  [8])
                 CVar5.
                 super_IteratorBase<const_wasm::SmallVector<wasm::Literal,_1UL>,_wasm::SmallVector<wasm::Literal,_1UL>::ConstIterator>
                 .parent;
      IVar6 = (IteratorBase<const_wasm::SmallVector<wasm::Literal,_1UL>,_wasm::SmallVector<wasm::Literal,_1UL>::ConstIterator>
               )SmallVector<wasm::Literal,_1UL>::end
                          ((SmallVector<wasm::Literal,_1UL> *)
                           __begin2.
                           super_IteratorBase<const_wasm::SmallVector<wasm::Literal,_1UL>,_wasm::SmallVector<wasm::Literal,_1UL>::ConstIterator>
                           .index);
      while( true ) {
        __end2.
        super_IteratorBase<const_wasm::SmallVector<wasm::Literal,_1UL>,_wasm::SmallVector<wasm::Literal,_1UL>::ConstIterator>
        .parent = (SmallVector<wasm::Literal,_1UL> *)IVar6.index;
        val = (value_type *)IVar6.parent;
        bVar1 = SmallVector<wasm::Literal,_1UL>::
                IteratorBase<const_wasm::SmallVector<wasm::Literal,_1UL>,_wasm::SmallVector<wasm::Literal,_1UL>::ConstIterator>
                ::operator!=((IteratorBase<const_wasm::SmallVector<wasm::Literal,_1UL>,_wasm::SmallVector<wasm::Literal,_1UL>::ConstIterator>
                              *)local_48,(ConstIterator *)&val);
        if (!bVar1) break;
        pvVar4 = SmallVector<wasm::Literal,_1UL>::ConstIterator::operator*
                           ((ConstIterator *)local_48);
        std::vector<wasm::Type,_std::allocator<wasm::Type>_>::push_back
                  ((vector<wasm::Type,_std::allocator<wasm::Type>_> *)&__range2,&pvVar4->type);
        SmallVector<wasm::Literal,_1UL>::
        IteratorBase<const_wasm::SmallVector<wasm::Literal,_1UL>,_wasm::SmallVector<wasm::Literal,_1UL>::ConstIterator>
        ::operator++((IteratorBase<const_wasm::SmallVector<wasm::Literal,_1UL>,_wasm::SmallVector<wasm::Literal,_1UL>::ConstIterator>
                      *)local_48);
        IVar6.index = (size_t)__end2.
                              super_IteratorBase<const_wasm::SmallVector<wasm::Literal,_1UL>,_wasm::SmallVector<wasm::Literal,_1UL>::ConstIterator>
                              .parent;
        IVar6.parent = (SmallVector<wasm::Literal,_1UL> *)val;
      }
      wasm::Type::Type((Type *)&this_local,(Tuple *)&__range2);
      std::vector<wasm::Type,_std::allocator<wasm::Type>_>::~vector
                ((vector<wasm::Type,_std::allocator<wasm::Type>_> *)&__range2);
    }
  }
  return (Type)(uintptr_t)this_local;
}

Assistant:

Type getType() const {
    if (empty()) {
      return Type::none;
    }
    if (size() == 1) {
      return (*this)[0].type;
    }
    std::vector<Type> types;
    for (auto& val : *this) {
      types.push_back(val.type);
    }
    return Type(types);
  }